

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Console.cpp
# Opt level: O0

void __thiscall Console::Prompt::Private::restoreCursorPosition(Private *this)

{
  char *data;
  usize len;
  undefined1 local_38 [8];
  String moveCmd;
  Private *this_local;
  
  if (this->stdoutCursorX != 0) {
    moveCmd._data.ref = (usize)this;
    String::String((String *)local_38);
    String::printf((String *)local_38,"\x1b[A\r\x1b[%dC",(ulong)(uint)this->stdoutCursorX);
    data = String::operator_cast_to_char_((String *)local_38);
    len = String::length((String *)local_38);
    writeConsole(this,data,len);
    String::~String((String *)local_38);
  }
  return;
}

Assistant:

void restoreCursorPosition()
  {
    if(stdoutCursorX)
    {
#ifdef _MSC_VER
      CONSOLE_SCREEN_BUFFER_INFO csbi;
      VERIFY(GetConsoleScreenBufferInfo(hOriginalStdOut, &csbi));
      csbi.dwCursorPosition.X = (SHORT)stdoutCursorX;
      --csbi.dwCursorPosition.Y;
      VERIFY(SetConsoleCursorPosition(hOriginalStdOut, csbi.dwCursorPosition));
#else
      String moveCmd;
      moveCmd.printf("\x1b[A\r\x1b[%dC", (int)stdoutCursorX);
      writeConsole(moveCmd, moveCmd.length());
#endif
    }
  }